

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::lazyPrint(ConsoleReporter *this)

{
  type tVar1;
  long in_RDI;
  ConsoleReporter *in_stack_00000020;
  ConsoleReporter *in_stack_00000070;
  ConsoleReporter *in_stack_000000e0;
  
  tVar1 = Option::operator_cast_to_function_pointer((Option<Catch::TestRunInfo> *)0x1c540c);
  if (tVar1 != 0) {
    lazyPrintRunInfo(in_stack_00000070);
  }
  tVar1 = Option::operator_cast_to_function_pointer((Option<Catch::GroupInfo> *)0x1c542a);
  if (tVar1 != 0) {
    lazyPrintGroupInfo(in_stack_00000020);
  }
  if ((*(byte *)(in_RDI + 0x188) & 1) == 0) {
    printTestCaseAndSectionHeader(in_stack_000000e0);
    *(undefined1 *)(in_RDI + 0x188) = 1;
  }
  *(undefined1 *)(in_RDI + 0x189) = 1;
  return;
}

Assistant:

void lazyPrint() {

            if( testRunInfo )
                lazyPrintRunInfo();
            if( unusedGroupInfo )
                lazyPrintGroupInfo();

            if( !m_headerPrinted ) {
                printTestCaseAndSectionHeader();
                m_headerPrinted = true;
            }
            m_atLeastOneTestCasePrinted = true;
        }